

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecuteProcessCommand.cxx
# Opt level: O3

void cmExecuteProcessCommandFixText
               (vector<char,_std::allocator<char>_> *output,bool strip_trailing_whitespace)

{
  pointer *ppcVar1;
  char cVar2;
  iterator __position;
  uint uVar3;
  int iVar4;
  ulong in_RAX;
  ulong uVar5;
  pointer pcVar6;
  ulong uVar7;
  pointer pcVar8;
  ulong uVar9;
  ulong uVar10;
  undefined8 uStack_28;
  
  pcVar8 = (output->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  pcVar6 = (output->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  uVar7 = (long)pcVar6 - (long)pcVar8;
  uStack_28 = in_RAX;
  if (uVar7 != 0) {
    uVar5 = 0;
    uVar3 = 1;
    uVar9 = 0;
    do {
      cVar2 = pcVar8[uVar5];
      uVar5 = (ulong)uVar3;
      uVar10 = uVar9;
      if ((cVar2 != '\0') && (((cVar2 != '\r' || (uVar7 <= uVar5)) || (pcVar8[uVar5] != '\n')))) {
        uVar10 = (ulong)((int)uVar9 + 1);
        pcVar8[uVar9] = cVar2;
        pcVar8 = (output->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar6 = (output->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      uVar7 = (long)pcVar6 - (long)pcVar8;
      uVar3 = uVar3 + 1;
      uVar9 = uVar10;
    } while (uVar5 < uVar7);
    if (!strip_trailing_whitespace || (int)uVar10 == 0) goto LAB_002ca5d9;
    do {
      cVar2 = pcVar8[uVar10 - 1];
      iVar4 = isspace((int)cVar2);
      if (((iVar4 == 0) && (cVar2 != '\r')) && (cVar2 != '\n')) goto LAB_002ca5d9;
      uVar10 = uVar10 - 1;
    } while (uVar10 != 0);
  }
  uVar10 = 0;
LAB_002ca5d9:
  std::vector<char,_std::allocator<char>_>::resize(output,uVar10 & 0xffffffff);
  uStack_28 = uStack_28 & 0xffffffffffffff;
  __position._M_current =
       (output->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (__position._M_current ==
      (output->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
              (output,__position,(char *)((long)&uStack_28 + 7));
  }
  else {
    *__position._M_current = '\0';
    ppcVar1 = &(output->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppcVar1 = *ppcVar1 + 1;
  }
  return;
}

Assistant:

void cmExecuteProcessCommandFixText(std::vector<char>& output,
                                    bool strip_trailing_whitespace)
{
  // Remove \0 characters and the \r part of \r\n pairs.
  unsigned int in_index = 0;
  unsigned int out_index = 0;
  while(in_index < output.size())
    {
    char c = output[in_index++];
    if((c != '\r' || !(in_index < output.size() && output[in_index] == '\n'))
       && c != '\0')
      {
      output[out_index++] = c;
      }
    }

  // Remove trailing whitespace if requested.
  if(strip_trailing_whitespace)
    {
    while(out_index > 0 &&
          cmExecuteProcessCommandIsWhitespace(output[out_index-1]))
      {
      --out_index;
      }
    }

  // Shrink the vector to the size needed.
  output.resize(out_index);

  // Put a terminator on the text string.
  output.push_back('\0');
}